

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testStateFeatureHasNoDefaultShape_shouldFail(void)

{
  bool bVar1;
  ResultType RVar2;
  ModelDescription *interface;
  FeatureDescription *feature;
  FeatureType *this;
  StateFeatureType *this_00;
  ArrayFeatureType *pAVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  ValidationPolicy validationPolicy;
  undefined1 local_70 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  feature = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&interface->state_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"x",(allocator<char> *)&validationPolicy);
  setupStateFeature(feature,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  this = CoreML::Specification::FeatureDescription::_internal_mutable_type(feature);
  this_00 = CoreML::Specification::FeatureType::_internal_mutable_statetype(this);
  pAVar3 = CoreML::Specification::StateFeatureType::_internal_mutable_arraytype(this_00);
  (pAVar3->shape_).current_size_ = 0;
  validationPolicy.allowsEmptyInput = true;
  validationPolicy.allowsEmptyOutput = true;
  validationPolicy.allowsMultipleFunctions = true;
  validationPolicy.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_70,interface,9,&validationPolicy);
  bVar1 = CoreML::Result::good((Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1d3);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = 
    "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy))).good())"
    ;
  }
  else {
    CoreML::validateModelDescription((Result *)local_70,interface,9,&validationPolicy);
    RVar2 = CoreML::Result::type((Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    iVar5 = 0;
    if (RVar2 == INVALID_MODEL_INTERFACE) goto LAB_00139ae9;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1d3);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = 
    "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).type())"
    ;
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 1;
LAB_00139ae9:
  CoreML::Specification::Model::~Model(&m);
  return iVar5;
}

Assistant:

int testStateFeatureHasNoDefaultShape_shouldFail() {
    Specification::Model m;
    auto *description = m.mutable_description();
    auto *state = description->add_state();

    setupStateFeature(state, "x");
    state->mutable_type()->mutable_statetype()->mutable_arraytype()->clear_shape();

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);

    return 0;
}